

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeLeaveCoPrhs4Col
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,int n)

{
  Status SVar1;
  Status *pSVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  long in_RDI;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff98;
  int n_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffa0;
  
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RDI + 0x238));
  pSVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::Desc::colStatus((Desc *)in_stack_ffffffffffffffa0,
                             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  SVar1 = *pSVar2;
  n_00 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (SVar1 != P_FIXED) {
    if (SVar1 == P_ON_LOWER) {
LAB_006c1808:
      pcVar3 = &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffffa0,n_00)->m_backend;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)pcVar3,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (pcVar3,in_stack_ffffffffffffff98);
      return;
    }
    if (SVar1 != P_ON_UPPER) {
      if (SVar1 == D_ON_UPPER) goto LAB_006c1808;
      if (((SVar1 != D_ON_LOWER) && (SVar1 != D_ON_BOTH)) && (SVar1 != D_UNDEFINED)) {
        pcVar3 = &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::maxObj(in_stack_ffffffffffffffa0,n_00)->m_backend;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffffa0,(int)((ulong)pcVar3 >> 0x20));
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffffa0,pcVar3);
        return;
      }
    }
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffffa0,n_00);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void SPxSolverBase<R>::computeLeaveCoPrhs4Col(int i, int n)
{
   assert(this->baseId(i).isSPxColId());
   assert(this->number(SPxColId(this->baseId(i))) == n);

   switch(this->desc().colStatus(n))
   {
   case SPxBasisBase<R>::Desc::D_UNDEFINED :
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
   case SPxBasisBase<R>::Desc::P_FIXED :
      assert(theLCbound[n] > R(-infinity));
      assert(EQ(theUCbound[n], theLCbound[n], this->epsilon()));

   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      assert(theUCbound[n] < R(infinity));
      (*theCoPrhs)[i] = theUCbound[n];
      break;

   case SPxBasisBase<R>::Desc::D_ON_UPPER :
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      assert(theLCbound[n] > R(-infinity));
      (*theCoPrhs)[i] = theLCbound[n];
      break;

   default:
      (*theCoPrhs)[i] = this->maxObj(n);
      //      (*theCoPrhs)[i] = 0;
      break;
   }
}